

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall
ImDrawList::AddCallback(ImDrawList *this,ImDrawCallback callback,void *callback_data)

{
  ImDrawCmd *pIVar1;
  
  if ((this->CmdBuffer).Size != 0) {
    pIVar1 = ImVector<ImDrawCmd>::back(&this->CmdBuffer);
    if ((pIVar1->ElemCount == 0) && (pIVar1->UserCallback == (ImDrawCallback)0x0))
    goto LAB_0016782f;
  }
  AddDrawCmd(this);
  pIVar1 = ImVector<ImDrawCmd>::back(&this->CmdBuffer);
LAB_0016782f:
  pIVar1->UserCallback = callback;
  pIVar1->UserCallbackData = callback_data;
  AddDrawCmd(this);
  return;
}

Assistant:

void ImDrawList::AddCallback(ImDrawCallback callback, void* callback_data)
{
    ImDrawCmd* current_cmd = CmdBuffer.Size ? &CmdBuffer.back() : NULL;
    if (!current_cmd || current_cmd->ElemCount != 0 || current_cmd->UserCallback != NULL)
    {
        AddDrawCmd();
        current_cmd = &CmdBuffer.back();
    }
    current_cmd->UserCallback = callback;
    current_cmd->UserCallbackData = callback_data;

    AddDrawCmd(); // Force a new command after us (see comment below)
}